

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal.cpp
# Opt level: O3

void am_generic_renew_copied_comp(Am_Object *object)

{
  bool bVar1;
  unsigned_short uVar2;
  Am_Slot_Key AVar3;
  int value;
  Am_Value *pAVar4;
  Am_Wrapper *pAVar5;
  ulong *puVar6;
  long lVar7;
  Am_Object *pAVar8;
  Am_Object current_component;
  Am_Object part;
  Am_Part_Iterator parts;
  Am_Value_List components;
  Am_Value_List new_components;
  Am_Part_Iterator local_98;
  Am_Value_List local_88;
  Am_Object local_78;
  Am_Part_Iterator local_70;
  Am_Value_List local_60;
  Am_Value_List local_50;
  long local_40;
  Am_Object *local_38;
  
  Am_Value_List::Am_Value_List(&local_60);
  local_98.owner.data = (Am_Object_Data *)object;
  pAVar4 = Am_Object::Get(object,0x82,0);
  Am_Value_List::operator=(&local_60,pAVar4);
  Am_Value_List::Am_Value_List(&local_50);
  Am_Object::Am_Object(&local_78,(Am_Object *)local_98.owner.data);
  Am_Part_Iterator::Am_Part_Iterator(&local_70,&local_78);
  Am_Object::~Am_Object(&local_78);
  uVar2 = Am_Part_Iterator::Length(&local_70);
  bVar1 = Am_Value_List::Empty(&local_60);
  if (uVar2 == 0 || bVar1) {
    Am_Value_List::Am_Value_List(&local_88);
    pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_88);
    Am_Object::Set((Am_Object *)local_98.owner.data,0x82,pAVar5,0);
    Am_Value_List::~Am_Value_List(&local_88);
  }
  else {
    puVar6 = (ulong *)operator_new__((ulong)uVar2 * 0x10 + 8);
    *puVar6 = (ulong)((uint)uVar2 + (uint)uVar2);
    pAVar8 = (Am_Object *)(puVar6 + 1);
    memset(pAVar8,0,(ulong)uVar2 * 0x10);
    local_88.data = (Am_Value_List_Data *)0x0;
    Am_Part_Iterator::Start(&local_70);
    local_38 = pAVar8;
    while (bVar1 = Am_Part_Iterator::Last(&local_70), !bVar1) {
      Am_Part_Iterator::Get(&local_98);
      Am_Object::operator=((Am_Object *)&local_88,&local_98.current);
      Am_Object::~Am_Object(&local_98.current);
      Am_Object::operator=(pAVar8 + uVar2,(Am_Object *)&local_88);
      pAVar4 = Am_Object::Get((Am_Object *)&local_88,0xc,0);
      Am_Object::operator=(pAVar8,pAVar4);
      pAVar8 = pAVar8 + 1;
      Am_Part_Iterator::Next(&local_70);
    }
    local_98.current.data = (Am_Object_Data *)0x0;
    Am_Value_List::Start(&local_60);
    local_40 = (long)puVar6 + (ulong)((uint)uVar2 * 8);
    value = 0;
    while (bVar1 = Am_Value_List::Last(&local_60), !bVar1) {
      pAVar4 = Am_Value_List::Get(&local_60);
      Am_Object::operator=(&local_98.current,pAVar4);
      AVar3 = Am_Object::Get_Key(&local_98.current);
      if (AVar3 != 2) {
        lVar7 = -8;
        pAVar8 = local_38;
        do {
          bVar1 = Am_Object::operator==(&local_98.current,pAVar8);
          if (bVar1) {
            pAVar8 = (Am_Object *)(local_40 - lVar7);
            Am_Object::Set(pAVar8,0x85,value,0);
            pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar8);
            Am_Value_List::Add(&local_50,pAVar5,Am_TAIL,true);
            value = value + 1;
            break;
          }
          lVar7 = lVar7 + -8;
          pAVar8 = pAVar8 + 1;
        } while ((ulong)((uint)uVar2 * 8) + 8 + lVar7 != 0);
      }
      Am_Value_List::Next(&local_60);
    }
    if (*puVar6 != 0) {
      lVar7 = *puVar6 << 3;
      do {
        Am_Object::~Am_Object((Am_Object *)((long)puVar6 + lVar7));
        lVar7 = lVar7 + -8;
      } while (lVar7 != 0);
    }
    operator_delete__(puVar6);
    pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_50);
    Am_Object::Set((Am_Object *)local_98.owner.data,0x82,pAVar5,0);
    Am_Object::~Am_Object(&local_98.current);
    Am_Object::~Am_Object((Am_Object *)&local_88);
  }
  Am_Object::~Am_Object(&local_70.owner);
  Am_Object::~Am_Object(&local_70.current);
  Am_Value_List::~Am_Value_List(&local_50);
  Am_Value_List::~Am_Value_List(&local_60);
  return;
}

Assistant:

void
am_generic_renew_copied_comp(Am_Object object)
{
  Am_Value_List components;
  components = object.Get(Am_GRAPHICAL_PARTS);
  Am_Value_List new_components;
  Am_Part_Iterator parts = object;
  int parts_length = parts.Length();
  if (components.Empty() || (parts_length == 0)) {
    object.Set(Am_GRAPHICAL_PARTS, Am_Value_List());
    return;
  }
  Am_Object *part_map = new Am_Object[parts_length * 2];
  Am_Object part;
  int i;
  for (i = 0, parts.Start(); !parts.Last(); ++i, parts.Next()) {
    part = parts.Get();
    part_map[i + parts_length] = part;
    part_map[i] = part.Get(Am_SOURCE_OF_COPY);
  }
  Am_Object current_component;
  int current_rank = 0;
  for (components.Start(); !components.Last(); components.Next()) {
    current_component = components.Get();
    if (current_component.Get_Key() == Am_NO_INHERIT)
      continue;
    for (i = 0; i < parts_length; ++i)
      if (current_component == part_map[i]) {
        part_map[i + parts_length].Set(Am_RANK, current_rank);
        new_components.Add(part_map[i + parts_length]);
        ++current_rank;
        break;
      }
  }
  delete[] part_map;
  object.Set(Am_GRAPHICAL_PARTS, new_components);
}